

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O2

int __thiscall
QDateTimeParser::findDay
          (QDateTimeParser *this,QStringView str,int startDay,int sectionIndex,QString *usedDay,
          int *used)

{
  int iVar1;
  SectionNode *pSVar2;
  int day;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_1a8;
  QLocale l;
  undefined1 local_188 [336];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = sectionNode(this,sectionIndex);
  if ((pSVar2->type & DaySectionMask) == NoSection) {
    local_188._0_4_ = 2;
    local_188._20_4_ = 0;
    local_188._4_4_ = 0;
    local_188._8_4_ = 0;
    local_188._12_4_ = 0;
    local_188._16_4_ = 0;
    local_188._24_8_ = "default";
    QMessageLogger::warning((QMessageLogger *)local_188,"QDateTimeParser::findDay Internal error");
    iVar1 = -1;
  }
  else {
    iVar1 = pSVar2->count;
    l.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
    (*this->_vptr_QDateTimeParser[6])(&l,this);
    memset(local_188 + 0x18,0xaa,0x138);
    local_188._0_4_ = 0xd;
    local_188._4_4_ = 0;
    local_188._8_4_ = 0;
    local_188._12_4_ = 0;
    local_188._16_8_ = local_188 + 0x18;
    QVarLengthArray<QString,_13LL>::reserve
              ((QVarLengthArray<QString,_13LL> *)local_188,(long)(8 - startDay));
    for (day = startDay; day < 8; day = day + 1) {
      QLocale::dayName((QString *)&local_1a8,&l,day,(uint)(iVar1 != 4));
      QVarLengthArray<QString,_13LL>::emplace_back<QString>
                ((QVarLengthArray<QString,_13LL> *)local_188,(QString *)&local_1a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
    }
    iVar1 = findTextEntry(str,(ShortVector<QString> *)local_188,usedDay,used);
    if (iVar1 < 0) {
      startDay = 0;
    }
    iVar1 = startDay + iVar1;
    QVarLengthArray<QString,_13LL>::~QVarLengthArray((ShortVector<QString> *)local_188);
    QLocale::~QLocale(&l);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QDateTimeParser::findDay(QStringView str, int startDay, int sectionIndex, QString *usedDay, int *used) const
{
    const SectionNode &sn = sectionNode(sectionIndex);
    if (!(sn.type & DaySectionMask)) {
        qWarning("QDateTimeParser::findDay Internal error");
        return -1;
    }

    QLocale::FormatType type = sn.count == 4 ? QLocale::LongFormat : QLocale::ShortFormat;
    QLocale l = locale();
    ShortVector<QString> daysOfWeek;
    daysOfWeek.reserve(8 - startDay);
    for (int day = startDay; day <= 7; ++day)
        daysOfWeek.append(l.dayName(day, type));

    const int index = findTextEntry(str, daysOfWeek, usedDay, used);
    return index < 0 ? index : index + startDay;
}